

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apngasm.cpp
# Opt level: O3

bool __thiscall
apngasm::APNGAsm::save(APNGAsm *this,string *outputPath,uchar coltype,uint first,uint loops)

{
  uchar uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FILE *pFVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uchar *pimage1;
  uchar *ptemp;
  uchar *ptemp_00;
  uchar *ptemp_01;
  uchar *pimage1_00;
  uchar *rows;
  uchar *puVar9;
  uchar *puVar10;
  uchar *puVar11;
  uchar *puVar12;
  long lVar13;
  pointer pAVar14;
  byte bVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  pointer pAVar19;
  undefined7 in_register_00000011;
  ulong uVar20;
  ulong __n;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint uVar25;
  uint uVar26;
  undefined2 uVar27;
  char cVar28;
  uint uVar29;
  int iVar30;
  ulong uVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  int iVar43;
  uchar coltype_00;
  uint local_1bc;
  uint local_1b8;
  int local_1b4;
  ulong local_1b0;
  uint zsize;
  FILE *local_190;
  ulong local_188;
  int local_17c;
  undefined8 local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  ulong local_158;
  uchar *local_150;
  uchar *local_148;
  int local_13c;
  uchar buf_fcTL [26];
  ulong local_108;
  uchar buf_acTL [8];
  uchar png_sign [8];
  uchar buf_IHDR [13];
  uchar png_Software [27];
  long lVar38;
  
  png_sign[0] = 0x89;
  png_sign[1] = 'P';
  png_sign[2] = 'N';
  png_sign[3] = 'G';
  png_sign[4] = '\r';
  png_sign[5] = '\n';
  png_sign[6] = '\x1a';
  png_sign[7] = '\n';
  builtin_memcpy(png_Software + 0x10,"sembler 3.0",0xb);
  builtin_memcpy(png_Software,"Software",9);
  builtin_memcpy(png_Software + 9,"APNG As",7);
  local_17c = (int)CONCAT71(in_register_00000011,coltype);
  uVar18 = 2;
  if (local_17c != 4) {
    uVar18 = (ulong)((uint)(local_17c == 6) * 3 + 1);
  }
  local_188 = 3;
  if (local_17c != 2) {
    local_188 = uVar18;
  }
  if (local_17c == 0) {
    if (this->_trnssize == 0) {
LAB_0013a45a:
      local_160 = 1;
LAB_0013a464:
      uVar18 = 0;
      local_178 = 0;
      goto LAB_0013a46d;
    }
    uVar18 = (ulong)this->_trns[1];
  }
  else if (coltype == '\x02') {
    if (this->_trnssize == 0) goto LAB_0013a45a;
    uVar18 = (ulong)((uint)this->_trns[1] | (uint)this->_trns[3] << 8 | (uint)this->_trns[5] << 0x10
                    );
  }
  else {
    local_178 = 1;
    uVar18 = 0;
    if (coltype == '\x03') {
      uVar18 = 0;
      if (this->_trnssize == 0) {
        local_160 = 1;
      }
      else {
        do {
          bVar32 = this->_trns[uVar18] == '\0';
          local_160 = (ulong)!bVar32;
          if (bVar32) goto LAB_0013a46d;
          uVar18 = uVar18 + 1;
        } while (this->_trnssize != (uint)uVar18);
      }
      goto LAB_0013a464;
    }
  }
  local_178 = 1;
  local_160 = 0;
LAB_0013a46d:
  uVar29 = this->_width * (int)local_188;
  uVar25 = this->_height;
  __n = (ulong)(uVar29 * uVar25);
  pimage1 = (uchar *)operator_new__(__n);
  ptemp = (uchar *)operator_new__(__n);
  ptemp_00 = (uchar *)operator_new__(__n);
  ptemp_01 = (uchar *)operator_new__(__n);
  pimage1_00 = (uchar *)operator_new__(__n);
  uVar6 = uVar29 + 1;
  local_158 = (ulong)uVar29;
  rows = (uchar *)operator_new__((ulong)(uVar25 * uVar6));
  local_190 = fopen((outputPath->_M_dataplus)._M_p,"wb");
  if (local_190 != (FILE *)0x0) {
    png_save_uint_32(buf_IHDR,this->_width);
    png_save_uint_32(buf_IHDR + 4,this->_height);
    buf_IHDR[8] = '\b';
    buf_IHDR[9] = (uchar)local_17c;
    buf_IHDR[10] = '\0';
    buf_IHDR[0xb] = '\0';
    buf_IHDR[0xc] = '\0';
    png_save_uint_32(buf_acTL,(int)((ulong)((long)(this->_frames).
                                                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(this->_frames).
                                                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                              0x7a44c6b - first);
    png_save_uint_32(buf_acTL + 4,loops);
    pFVar5 = local_190;
    fwrite(png_sign,1,8,local_190);
    write_chunk(this,(FILE *)pFVar5,"IHDR",buf_IHDR,0xd);
    uVar25 = 0;
    if (1 < (ulong)(((long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 4) * -0xf4898d5f85bb395)) {
      write_chunk(this,(FILE *)local_190,"acTL",buf_acTL,8);
      uVar25 = first;
    }
    if (this->_palsize != 0) {
      write_chunk(this,(FILE *)local_190,"PLTE",&this->_palette[0].r,this->_palsize * 3);
    }
    if (this->_trnssize != 0) {
      write_chunk(this,(FILE *)local_190,"tRNS",this->_trns,this->_trnssize);
    }
    *(undefined1 (*) [16])((long)&(this->_op_zstream1).zfree + 4) = (undefined1  [16])0x0;
    (this->_op_zstream1).zalloc = (alloc_func)0x0;
    (this->_op_zstream1).zfree = (free_func)0x0;
    deflateInit2_(&this->_op_zstream1,2,8,0xf,8,0,"1.2.11",0x70);
    (this->_op_zstream2).zalloc = (alloc_func)0x0;
    (this->_op_zstream2).zfree = (free_func)0x0;
    *(undefined1 (*) [16])((long)&(this->_op_zstream2).zfree + 4) = (undefined1  [16])0x0;
    deflateInit2_(&this->_op_zstream2,2,8,0xf,8,1,"1.2.11",0x70);
    local_1bc = this->_height;
    uVar29 = local_1bc * uVar6;
    uVar20 = (ulong)((uVar29 + 0x3f >> 6) + (uVar29 + 7 >> 3) + uVar29 + 0xb);
    local_148 = (uchar *)operator_new__(uVar20);
    puVar9 = (uchar *)operator_new__(uVar20);
    this->_op_zbuf1 = puVar9;
    local_168 = uVar20;
    puVar9 = (uchar *)operator_new__(uVar20);
    this->_op_zbuf2 = puVar9;
    uVar20 = (ulong)uVar6;
    puVar9 = (uchar *)operator_new__(uVar20);
    this->_row_buf = puVar9;
    puVar10 = (uchar *)operator_new__(uVar20);
    this->_sub_row = puVar10;
    local_150 = (uchar *)operator_new__(uVar20);
    this->_up_row = local_150;
    puVar11 = (uchar *)operator_new__(uVar20);
    this->_avg_row = puVar11;
    puVar12 = (uchar *)operator_new__(uVar20);
    iVar30 = local_17c;
    this->_paeth_row = puVar12;
    *puVar9 = '\0';
    *puVar10 = '\x01';
    *local_150 = '\x02';
    *puVar11 = '\x03';
    *puVar12 = '\x04';
    uVar6 = this->_width;
    local_1b0 = (ulong)uVar6;
    this->_next_seq_num = 0;
    lVar13 = 0x6c;
    auVar33 = _DAT_00167090;
    do {
      if (SUB164(auVar33 ^ _DAT_001670a0,4) == -0x80000000 &&
          SUB164(auVar33 ^ _DAT_001670a0,0) < -0x7ffffffa) {
        *(undefined4 *)((long)(this->_op + -2) + lVar13) = 0;
        *(undefined4 *)
         ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                 super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl
                 .super__Vector_impl_data._M_start + lVar13) = 0;
      }
      lVar38 = auVar33._8_8_;
      auVar33._0_8_ = auVar33._0_8_ + 2;
      auVar33._8_8_ = lVar38 + 2;
      lVar13 = lVar13 + 0x50;
    } while (lVar13 != 0x15c);
    iVar8 = (int)local_188;
    deflate_rect_op(this,((this->_frames).
                          super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_pixels,0,0,uVar6,local_1bc,
                    iVar8,(int)local_158,(int)local_168,0);
    local_170 = 0;
    deflate_rect_fin(this,local_148,&zsize,iVar8,(int)local_158,rows,(int)local_168,0);
    if (uVar25 != 0) {
      write_IDATs(this,(FILE *)local_190,0,local_148,zsize,uVar29);
      auVar33 = _DAT_001670a0;
      lVar13 = 0x6c;
      auVar34 = _DAT_00167090;
      do {
        if (SUB164(auVar34 ^ auVar33,4) == -0x80000000 && SUB164(auVar34 ^ auVar33,0) < -0x7ffffffa)
        {
          *(undefined4 *)((long)(this->_op + -2) + lVar13) = 0;
          *(undefined4 *)
           ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_start + lVar13) = 0;
        }
        lVar38 = auVar34._8_8_;
        auVar34._0_8_ = auVar34._0_8_ + 2;
        auVar34._8_8_ = lVar38 + 2;
        lVar13 = lVar13 + 0x50;
      } while (lVar13 != 0x15c);
      iVar8 = (int)local_188;
      iVar16 = (int)local_158;
      deflate_rect_op(this,(this->_frames).
                           super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                           ._M_impl.super__Vector_impl_data._M_start[1]._pixels,0,0,uVar6,local_1bc,
                      iVar8,iVar16,(int)local_168,0);
      deflate_rect_fin(this,local_148,&zsize,iVar8,iVar16,rows,(int)local_168,0);
    }
    puVar9 = (uchar *)(ulong)uVar25;
    pAVar14 = (this->_frames).
              super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
              super__Vector_impl_data._M_start;
    pAVar19 = (this->_frames).
              super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
              super__Vector_impl_data._M_finish;
    uVar20 = ((long)pAVar19 - (long)pAVar14 >> 4) * -0xf4898d5f85bb395;
    if (puVar9 < (uchar *)(uVar20 - 1)) {
      cVar28 = (char)iVar30;
      local_13c = (uint)(cVar28 == '\x06') * 2;
      if (cVar28 == '\x04') {
        local_13c = 1;
      }
      local_108 = 0;
      local_1b4 = 0;
      local_170 = 0;
      puVar10 = puVar9;
      do {
        auVar34 = _DAT_001670c0;
        auVar33 = _DAT_001670a0;
        lVar13 = 0x6c;
        auVar35 = _DAT_00167090;
        do {
          if (SUB164(auVar35 ^ auVar33,4) == -0x80000000 &&
              SUB164(auVar35 ^ auVar33,0) < -0x7ffffffa) {
            *(undefined4 *)((long)(this->_op + -2) + lVar13) = 0;
            *(undefined4 *)
             ((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                     super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar13) = 0;
          }
          lVar38 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + auVar34._0_8_;
          auVar35._8_8_ = lVar38 + auVar34._8_8_;
          lVar13 = lVar13 + 0x50;
        } while (lVar13 != 0x15c);
        puVar11 = puVar10 + 1;
        coltype_00 = (uchar)iVar30;
        uVar25 = (uint)uVar18;
        local_150 = puVar10;
        get_rect(this,this->_width,this->_height,pAVar14[(long)puVar10]._pixels,
                 pAVar14[(long)(puVar10 + 1)]._pixels,ptemp,coltype_00,(uint)local_188,
                 (uint)local_158,(int)local_168,(uint)local_178,uVar25,0);
        uVar27 = (undefined2)uVar18;
        uVar1 = (uchar)(uVar18 >> 0x10);
        iVar30 = (int)local_1b0;
        if ((char)local_160 == '\0') {
          pAVar14 = (this->_frames).
                    super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          memcpy(pimage1,pAVar14[(long)puVar10]._pixels,__n);
          uVar6 = this->_width;
          if (coltype_00 == '\x02') {
            if (local_1bc != 0) {
              lVar13 = local_1b0 - 1;
              auVar36._8_4_ = (int)lVar13;
              auVar36._0_8_ = lVar13;
              auVar36._12_4_ = (int)((ulong)lVar13 >> 0x20);
              iVar16 = local_1b4 * uVar6 + (int)local_170;
              uVar7 = iVar16 * 3 + 9;
              iVar8 = uVar6 * 3;
              uVar21 = iVar16 * 3 + 6;
              uVar22 = iVar16 * 3 + 3;
              uVar23 = iVar16 * 3;
              uVar26 = 0;
              do {
                auVar33 = _DAT_001670a0;
                uVar20 = local_1b0 + 3 & 0x1fffffffc;
                auVar34 = _DAT_00167090;
                auVar35 = _DAT_001670d0;
                uVar17 = uVar7;
                uVar2 = uVar22;
                uVar3 = uVar21;
                uVar4 = uVar23;
                if (iVar30 != 0) {
                  do {
                    iVar16 = SUB164(auVar36 ^ auVar33,0);
                    bVar32 = iVar16 < SUB164(auVar34 ^ auVar33,0);
                    iVar24 = SUB164(auVar36 ^ auVar33,4);
                    iVar43 = SUB164(auVar34 ^ auVar33,4);
                    if ((bool)(~(iVar24 < iVar43 || iVar43 == iVar24 && bVar32) & 1)) {
                      pimage1[(ulong)uVar4 + 2] = uVar1;
                      *(undefined2 *)(pimage1 + uVar4) = uVar27;
                    }
                    if (iVar24 >= iVar43 && (iVar43 != iVar24 || !bVar32)) {
                      pimage1[(ulong)uVar2 + 2] = uVar1;
                      *(undefined2 *)(pimage1 + uVar2) = uVar27;
                    }
                    iVar43 = SUB164(auVar35 ^ auVar33,4);
                    if (iVar43 <= iVar24 &&
                        (iVar43 != iVar24 || SUB164(auVar35 ^ auVar33,0) <= iVar16)) {
                      pimage1[(ulong)uVar3 + 2] = uVar1;
                      *(undefined2 *)(pimage1 + uVar3) = uVar27;
                      pimage1[(ulong)uVar17 + 2] = uVar1;
                      *(undefined2 *)(pimage1 + uVar17) = uVar27;
                    }
                    auVar42._0_8_ = auVar34._0_8_ + 4;
                    auVar42._8_8_ = auVar34._8_8_ + 4;
                    auVar40._0_8_ = auVar35._0_8_ + 4;
                    auVar40._8_8_ = auVar35._8_8_ + 4;
                    uVar20 = uVar20 - 4;
                    auVar34 = auVar42;
                    auVar35 = auVar40;
                    uVar17 = uVar17 + 0xc;
                    uVar2 = uVar2 + 0xc;
                    uVar3 = uVar3 + 0xc;
                    uVar4 = uVar4 + 0xc;
                  } while (uVar20 != 0);
                }
                uVar26 = uVar26 + 1;
                uVar7 = uVar7 + iVar8;
                uVar21 = uVar21 + iVar8;
                uVar22 = uVar22 + iVar8;
                uVar23 = uVar23 + iVar8;
              } while (uVar26 != local_1bc);
            }
          }
          else if (local_1bc != 0) {
            bVar15 = (byte)local_13c;
            uVar20 = (ulong)local_1bc;
            iVar8 = (int)local_188;
            uVar23 = (local_1b4 * uVar6 + (int)local_170) * iVar8;
            do {
              memset(pimage1 + uVar23,uVar25 & 0xff,(ulong)(uint)(iVar30 << (bVar15 & 0x1f)));
              uVar23 = uVar23 + iVar8 * uVar6;
              uVar20 = uVar20 - 1;
            } while (uVar20 != 0);
          }
          get_rect(this,uVar6,this->_height,pimage1,pAVar14[(long)puVar11]._pixels,ptemp_00,
                   coltype_00,(uint)local_188,(uint)local_158,(int)local_168,1,uVar25,1);
        }
        if (puVar9 < local_150) {
          get_rect(this,this->_width,this->_height,pimage1_00,
                   (this->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)puVar11]._pixels,ptemp_01,
                   coltype_00,(uint)local_188,(uint)local_158,(int)local_168,(uint)local_178,uVar25,
                   2);
        }
        uVar6 = this->_op[0].size;
        uVar20 = 0;
        lVar13 = 0x6c;
        uVar23 = 1;
        do {
          if ((*(int *)((long)&(((APNGAsm *)(this->_op + -1))->_frames).
                               super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar13) != 0) &&
             (uVar7 = *(uint *)((long)this->_op + lVar13 + -0x3c), uVar7 < uVar6)) {
            uVar20 = (ulong)uVar23;
            uVar6 = uVar7;
          }
          lVar13 = lVar13 + 0x28;
          uVar23 = uVar23 + 1;
        } while (lVar13 != 0x134);
        iVar8 = (int)uVar20;
        this->_next_seq_num = this->_next_seq_num + 1;
        png_save_uint_32(buf_fcTL);
        png_save_uint_32(buf_fcTL + 4,local_1b0);
        png_save_uint_32(buf_fcTL + 8,local_1bc);
        png_save_uint_32(buf_fcTL + 0xc,local_170);
        png_save_uint_32(buf_fcTL + 0x10,local_1b4);
        png_save_uint_16(buf_fcTL + 0x14,
                         (this->_frames).
                         super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)puVar10]._delayNum);
        png_save_uint_16(buf_fcTL + 0x16,
                         (this->_frames).
                         super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)puVar10]._delayDen);
        pFVar5 = local_190;
        buf_fcTL[0x18] = (uchar)(uVar20 >> 1);
        buf_fcTL[0x19] = (uchar)local_108;
        write_chunk(this,(FILE *)local_190,"fcTL",buf_fcTL,0x1a);
        write_IDATs(this,(FILE *)pFVar5,(int)local_150,local_148,zsize,uVar29);
        uVar6 = (uint)(uVar20 >> 1) & 0xff;
        if ((uVar6 != 2) &&
           (memcpy(pimage1_00,
                   (this->_frames).
                   super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                   _M_impl.super__Vector_impl_data._M_start[(long)puVar10]._pixels,__n), uVar6 == 1)
           ) {
          if ((char)local_17c == '\x02') {
            if (local_1bc != 0) {
              local_150 = (uchar *)(local_1b0 + 3 & 0x1fffffffc);
              lVar13 = local_1b0 - 1;
              auVar37._8_4_ = (int)lVar13;
              auVar37._0_8_ = lVar13;
              auVar37._12_4_ = (int)((ulong)lVar13 >> 0x20);
              iVar24 = (int)local_170 + local_1b4 * this->_width;
              local_1b8 = iVar24 * 3 + 9;
              iVar16 = this->_width * 3;
              uVar6 = iVar24 * 3 + 6;
              uVar23 = iVar24 * 3 + 3;
              uVar25 = iVar24 * 3;
              uVar7 = 0;
              auVar37 = auVar37 ^ _DAT_001670a0;
              do {
                auVar34 = _DAT_001670e0;
                auVar33 = _DAT_001670a0;
                puVar10 = local_150;
                auVar35 = _DAT_00167090;
                auVar36 = _DAT_001670d0;
                uVar17 = local_1b8;
                uVar21 = uVar23;
                uVar22 = uVar6;
                uVar26 = uVar25;
                if (iVar30 != 0) {
                  do {
                    auVar42 = auVar35 ^ auVar33;
                    iVar24 = auVar37._4_4_;
                    if ((bool)(~(auVar42._4_4_ == iVar24 && auVar37._0_4_ < auVar42._0_4_ ||
                                iVar24 < auVar42._4_4_) & 1)) {
                      pimage1_00[(ulong)uVar26 + 2] = uVar1;
                      *(undefined2 *)(pimage1_00 + uVar26) = uVar27;
                    }
                    if ((auVar42._12_4_ != auVar37._12_4_ || auVar42._8_4_ <= auVar37._8_4_) &&
                        auVar42._12_4_ <= auVar37._12_4_) {
                      pimage1_00[(ulong)uVar21 + 2] = uVar1;
                      *(undefined2 *)(pimage1_00 + uVar21) = uVar27;
                    }
                    auVar42 = auVar36 ^ auVar33;
                    iVar43 = auVar42._4_4_;
                    if (iVar43 <= iVar24 && (iVar43 != iVar24 || auVar42._0_4_ <= auVar37._0_4_)) {
                      pimage1_00[(ulong)uVar22 + 2] = uVar1;
                      *(undefined2 *)(pimage1_00 + uVar22) = uVar27;
                      pimage1_00[(ulong)uVar17 + 2] = uVar1;
                      *(undefined2 *)(pimage1_00 + uVar17) = uVar27;
                    }
                    lVar13 = auVar34._0_8_;
                    auVar39._0_8_ = auVar35._0_8_ + lVar13;
                    lVar38 = auVar34._8_8_;
                    auVar39._8_8_ = auVar35._8_8_ + lVar38;
                    auVar41._0_8_ = auVar36._0_8_ + lVar13;
                    auVar41._8_8_ = auVar36._8_8_ + lVar38;
                    puVar10 = puVar10 + -4;
                    auVar35 = auVar39;
                    auVar36 = auVar41;
                    uVar17 = uVar17 + 0xc;
                    uVar21 = uVar21 + 0xc;
                    uVar22 = uVar22 + 0xc;
                    uVar26 = uVar26 + 0xc;
                  } while (puVar10 != (uchar *)0x0);
                }
                uVar7 = uVar7 + 1;
                local_1b8 = local_1b8 + iVar16;
                uVar6 = uVar6 + iVar16;
                uVar23 = uVar23 + iVar16;
                uVar25 = uVar25 + iVar16;
              } while (uVar7 != local_1bc);
            }
          }
          else if (local_1bc != 0) {
            uVar6 = this->_width;
            bVar15 = (byte)local_13c;
            uVar31 = (ulong)local_1bc;
            iVar16 = (int)local_188;
            uVar23 = ((int)local_170 + local_1b4 * uVar6) * iVar16;
            do {
              memset(pimage1_00 + uVar23,uVar25 & 0xff,(ulong)(uint)(iVar30 << (bVar15 & 0x1f)));
              uVar23 = uVar23 + uVar6 * iVar16;
              uVar31 = uVar31 - 1;
            } while (uVar31 != 0);
          }
        }
        local_170 = (ulong)(uint)this->_op[iVar8].x;
        local_1b4 = this->_op[iVar8].y;
        local_1b0 = (ulong)(uint)this->_op[iVar8].w;
        local_1bc = this->_op[iVar8].h;
        local_108 = uVar20 & 0xffffffffffffff01;
        deflate_rect_fin(this,local_148,&zsize,(int)local_188,(int)local_158,rows,(int)local_168,
                         iVar8);
        pAVar14 = (this->_frames).
                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pAVar19 = (this->_frames).
                  super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar20 = ((long)pAVar19 - (long)pAVar14 >> 4) * -0xf4898d5f85bb395;
        puVar10 = puVar11;
        iVar30 = local_17c;
      } while (puVar11 < (uchar *)(uVar20 - 1));
    }
    else {
      local_1b4 = 0;
      local_108._0_1_ = '\0';
    }
    if (1 < uVar20) {
      this->_next_seq_num = this->_next_seq_num + 1;
      png_save_uint_32(buf_fcTL);
      png_save_uint_32(buf_fcTL + 4,local_1b0);
      png_save_uint_32(buf_fcTL + 8,local_1bc);
      png_save_uint_32(buf_fcTL + 0xc,local_170);
      png_save_uint_32(buf_fcTL + 0x10,local_1b4);
      png_save_uint_16(buf_fcTL + 0x14,
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]._delayNum);
      png_save_uint_16(buf_fcTL + 0x16,
                       (this->_frames).
                       super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1]._delayDen);
      buf_fcTL[0x18] = '\0';
      buf_fcTL[0x19] = (uchar)local_108;
      write_chunk(this,(FILE *)local_190,"fcTL",buf_fcTL,0x1a);
      pAVar14 = (this->_frames).
                super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
                super__Vector_impl_data._M_start;
      pAVar19 = (this->_frames).
                super__Vector_base<apngasm::APNGFrame,_std::allocator<apngasm::APNGFrame>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    puVar9 = local_148;
    pFVar5 = local_190;
    write_IDATs(this,(FILE *)local_190,
                (int)((ulong)((long)pAVar19 - (long)pAVar14) >> 4) * 0x7a44c6b + -1,local_148,zsize,
                uVar29);
    write_chunk(this,(FILE *)pFVar5,"tEXt",png_Software,0x1b);
    write_chunk(this,(FILE *)pFVar5,"IEND",(uchar *)0x0,0);
    fclose(pFVar5);
    operator_delete__(puVar9);
    if (this->_op_zbuf1 != (uchar *)0x0) {
      operator_delete__(this->_op_zbuf1);
    }
    if (this->_op_zbuf2 != (uchar *)0x0) {
      operator_delete__(this->_op_zbuf2);
    }
    if (this->_row_buf != (uchar *)0x0) {
      operator_delete__(this->_row_buf);
    }
    if (this->_sub_row != (uchar *)0x0) {
      operator_delete__(this->_sub_row);
    }
    if (this->_up_row != (uchar *)0x0) {
      operator_delete__(this->_up_row);
    }
    if (this->_avg_row != (uchar *)0x0) {
      operator_delete__(this->_avg_row);
    }
    if (this->_paeth_row != (uchar *)0x0) {
      operator_delete__(this->_paeth_row);
    }
    deflateEnd(&this->_op_zstream1);
    deflateEnd(&this->_op_zstream2);
    operator_delete__(pimage1);
    operator_delete__(ptemp);
    operator_delete__(ptemp_00);
    operator_delete__(ptemp_01);
    operator_delete__(pimage1_00);
    operator_delete__(rows);
  }
  return local_190 != (FILE *)0x0;
}

Assistant:

bool APNGAsm::save(const std::string &outputPath, unsigned char coltype, unsigned int first, unsigned int loops)
  {
    unsigned int    j, k;
    unsigned int    has_tcolor = 0;
    unsigned int    tcolor = 0;
    unsigned int    i, rowbytes, imagesize;
    unsigned int    idat_size, zbuf_size, zsize;
    unsigned char * zbuf;
    FILE*           f;
    unsigned char   png_sign[8] = {137,  80,  78,  71,  13,  10,  26,  10};
    unsigned char   png_Software[27] = { 83, 111, 102, 116, 119, 97, 114, 101, '\0',
                                         65,  80,  78,  71,  32, 65, 115, 115, 101,
                                        109,  98, 108, 101, 114, 32,  51,  46,  48};

    unsigned int bpp = 1;
    if (coltype == 2)
      bpp = 3;
    else
    if (coltype == 4)
      bpp = 2;
    else
    if (coltype == 6)
      bpp = 4;

    if (coltype == 0)
    {
      if (_trnssize)
      {
        has_tcolor = 1;
        tcolor = _trns[1];
      }
    }
    else
    if (coltype == 2)
    {
      if (_trnssize)
      {
        has_tcolor = 1;
        tcolor = (((_trns[5]<<8)+_trns[3])<<8)+_trns[1];
      }
    }
    else
    if (coltype == 3)
    {
      for (i=0; i<_trnssize; i++)
      if (_trns[i] == 0)
      {
        has_tcolor = 1;
        tcolor = i;
        break;
      }
    }
    else
    {
      has_tcolor = 1;
      tcolor = 0;
    }

    rowbytes  = _width * bpp;
    imagesize = rowbytes * _height;

    unsigned char * temp  = new unsigned char[imagesize];
    unsigned char * over1 = new unsigned char[imagesize];
    unsigned char * over2 = new unsigned char[imagesize];
    unsigned char * over3 = new unsigned char[imagesize];
    unsigned char * prev  = new unsigned char[imagesize];
    unsigned char * rows  = new unsigned char[(rowbytes + 1) * _height];

    if ((f = fopen(outputPath.c_str(), "wb")) != 0)
    {
      unsigned char buf_IHDR[13];
      unsigned char buf_acTL[8];
      unsigned char buf_fcTL[26];

      png_save_uint_32(buf_IHDR, _width);
      png_save_uint_32(buf_IHDR + 4, _height);
      buf_IHDR[8] = 8;
      buf_IHDR[9] = coltype;
      buf_IHDR[10] = 0;
      buf_IHDR[11] = 0;
      buf_IHDR[12] = 0;

      png_save_uint_32(buf_acTL, _frames.size() - first);
      png_save_uint_32(buf_acTL + 4, loops);

      fwrite(png_sign, 1, 8, f);

      write_chunk(f, "IHDR", buf_IHDR, 13);

      if (_frames.size() > 1)
        write_chunk(f, "acTL", buf_acTL, 8);
      else
        first = 0;

      if (_palsize > 0)
        write_chunk(f, "PLTE", (unsigned char *)(&_palette), _palsize*3);

      if (_trnssize > 0)
        write_chunk(f, "tRNS", _trns, _trnssize);

      _op_zstream1.data_type = Z_BINARY;
      _op_zstream1.zalloc = Z_NULL;
      _op_zstream1.zfree = Z_NULL;
      _op_zstream1.opaque = Z_NULL;
      deflateInit2(&_op_zstream1, Z_BEST_SPEED+1, 8, 15, 8, Z_DEFAULT_STRATEGY);

      _op_zstream2.data_type = Z_BINARY;
      _op_zstream2.zalloc = Z_NULL;
      _op_zstream2.zfree = Z_NULL;
      _op_zstream2.opaque = Z_NULL;
      deflateInit2(&_op_zstream2, Z_BEST_SPEED+1, 8, 15, 8, Z_FILTERED);

      idat_size = (rowbytes + 1) * _height;
      zbuf_size = idat_size + ((idat_size + 7) >> 3) + ((idat_size + 63) >> 6) + 11;

      zbuf = new unsigned char[zbuf_size];
      _op_zbuf1 = new unsigned char[zbuf_size];
      _op_zbuf2 = new unsigned char[zbuf_size];
      _row_buf = new unsigned char[rowbytes + 1];
      _sub_row = new unsigned char[rowbytes + 1];
      _up_row = new unsigned char[rowbytes + 1];
      _avg_row = new unsigned char[rowbytes + 1];
      _paeth_row = new unsigned char[rowbytes + 1];

      _row_buf[0] = 0;
      _sub_row[0] = 1;
      _up_row[0] = 2;
      _avg_row[0] = 3;
      _paeth_row[0] = 4;

      unsigned int x0 = 0;
      unsigned int y0 = 0;
      unsigned int w0 = _width;
      unsigned int h0 = _height;
      unsigned char bop = 0;
      unsigned char dop = 0;
      _next_seq_num = 0;

      for (j=0; j<6; j++)
        _op[j].valid = 0;
      deflate_rect_op(_frames[0]._pixels, x0, y0, w0, h0, bpp, rowbytes, zbuf_size, 0);
      deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, 0);

      if (first)
      {
        write_IDATs(f, 0, zbuf, zsize, idat_size);

        for (j=0; j<6; j++)
          _op[j].valid = 0;
        deflate_rect_op(_frames[1]._pixels, x0, y0, w0, h0, bpp, rowbytes, zbuf_size, 0);
        deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, 0);
      }

      for (size_t n = first; n < _frames.size()-1; ++n)
      {
        unsigned int op_min;
        int          op_best;

        for (j=0; j<6; j++)
          _op[j].valid = 0;

        /* dispose = none */
        get_rect(_width, _height, _frames[n]._pixels, _frames[n+1]._pixels, over1, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 0);

        /* dispose = background */
        if (has_tcolor)
        {
          memcpy(temp, _frames[n]._pixels, imagesize);
          if (coltype == 2)
            for (j=0; j<h0; j++)
              for (k=0; k<w0; k++)
                memcpy(temp + ((j+y0)*_width + (k+x0))*3, &tcolor, 3);
          else
            for (j=0; j<h0; j++)
              memset(temp + ((j+y0)*_width + x0)*bpp, tcolor, w0*bpp);

          get_rect(_width, _height, temp, _frames[n+1]._pixels, over2, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 1);
        }

        /* dispose = previous */
        if (n > first)
          get_rect(_width, _height, prev, _frames[n+1]._pixels, over3, coltype, bpp, rowbytes, zbuf_size, has_tcolor, tcolor, 2);

        op_min = _op[0].size;
        op_best = 0;
        for (j=1; j<6; j++)
        if (_op[j].valid)
        {
          if (_op[j].size < op_min)
          {
            op_min = _op[j].size;
            op_best = j;
          }
        }

        dop = op_best >> 1;

        png_save_uint_32(buf_fcTL, _next_seq_num++);
        png_save_uint_32(buf_fcTL + 4, w0);
        png_save_uint_32(buf_fcTL + 8, h0);
        png_save_uint_32(buf_fcTL + 12, x0);
        png_save_uint_32(buf_fcTL + 16, y0);
        png_save_uint_16(buf_fcTL + 20, _frames[n]._delayNum);
        png_save_uint_16(buf_fcTL + 22, _frames[n]._delayDen);
        buf_fcTL[24] = dop;
        buf_fcTL[25] = bop;
        write_chunk(f, "fcTL", buf_fcTL, 26);

        write_IDATs(f, n, zbuf, zsize, idat_size);

        /* process apng dispose - begin */
        if (dop != 2)
          memcpy(prev, _frames[n]._pixels, imagesize);

        if (dop == 1)
        {
          if (coltype == 2)
            for (j=0; j<h0; j++)
              for (k=0; k<w0; k++)
                memcpy(prev + ((j+y0)*_width + (k+x0))*3, &tcolor, 3);
          else
            for (j=0; j<h0; j++)
              memset(prev + ((j+y0)*_width + x0)*bpp, tcolor, w0*bpp);
        }
        /* process apng dispose - end */

        x0 = _op[op_best].x;
        y0 = _op[op_best].y;
        w0 = _op[op_best].w;
        h0 = _op[op_best].h;
        bop = op_best & 1;

        deflate_rect_fin(zbuf, &zsize, bpp, rowbytes, rows, zbuf_size, op_best);
      }

      if (_frames.size() > 1)
      {
        png_save_uint_32(buf_fcTL, _next_seq_num++);
        png_save_uint_32(buf_fcTL + 4, w0);
        png_save_uint_32(buf_fcTL + 8, h0);
        png_save_uint_32(buf_fcTL + 12, x0);
        png_save_uint_32(buf_fcTL + 16, y0);
        png_save_uint_16(buf_fcTL + 20, _frames[_frames.size()-1]._delayNum);
        png_save_uint_16(buf_fcTL + 22, _frames[_frames.size()-1]._delayDen);
        buf_fcTL[24] = 0;
        buf_fcTL[25] = bop;
        write_chunk(f, "fcTL", buf_fcTL, 26);
      }

      write_IDATs(f, _frames.size()-1, zbuf, zsize, idat_size);

      write_chunk(f, "tEXt", png_Software, 27);
      write_chunk(f, "IEND", 0, 0);
      fclose(f);

      delete[] zbuf;
      delete[] _op_zbuf1;
      delete[] _op_zbuf2;
      delete[] _row_buf;
      delete[] _sub_row;
      delete[] _up_row;
      delete[] _avg_row;
      delete[] _paeth_row;

      deflateEnd(&_op_zstream1);
      deflateEnd(&_op_zstream2);
    }
    else
      return false;

    delete[] temp;
    delete[] over1;
    delete[] over2;
    delete[] over3;
    delete[] prev;
    delete[] rows;

    return true;
  }